

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sig.c
# Opt level: O1

size_t cmdSigEnc(octet *buf,cmd_sig_t *sig)

{
  bool_t bVar1;
  size_t sVar2;
  size_t sVar3;
  octet *poVar4;
  long lVar5;
  octet *der;
  der_anchor_t Signature [1];
  der_anchor_t dStack_48;
  
  sVar2 = derTSEQEncStart(&dStack_48,buf,0,0x30);
  poVar4 = buf + sVar2;
  if (buf == (octet *)0x0) {
    poVar4 = (octet *)0x0;
  }
  sVar3 = derEnc(poVar4,0x30,sig->certs,sig->certs_len);
  der = poVar4 + sVar3;
  if (poVar4 == (octet *)0x0) {
    der = (octet *)0x0;
  }
  lVar5 = sVar3 + sVar2;
  bVar1 = memIsZero(sig->date,6);
  if (bVar1 == 0) {
    sVar2 = derEnc(der,4,sig->date,6);
    if (der != (octet *)0x0) {
      der = der + sVar2;
    }
    lVar5 = lVar5 + sVar2;
  }
  sVar2 = derEnc(der,4,sig,sig->sig_len);
  poVar4 = der + sVar2;
  if (der == (octet *)0x0) {
    poVar4 = (octet *)0x0;
  }
  sVar3 = derTSEQEncStop(poVar4,sVar2 + lVar5,&dStack_48);
  return sVar3 + sVar2 + lVar5;
}

Assistant:

static size_t cmdSigEnc(octet buf[], const cmd_sig_t* sig)
{
	der_anchor_t Signature[1];
	size_t count = 0;
	// pre
	ASSERT(cmdSigSeemsValid(sig));
	// начать кодирование...
	derEncStep(derSEQEncStart(Signature, buf, count), buf, count);
	// ...сертификаты...
	derEncStep(derEnc(buf, 0x30, sig->certs, sig->certs_len), buf, count);
	// ...дата...
	if (!memIsZero(sig->date, 6))
		derEncStep(derOCTEnc(buf, sig->date, 6), buf, count);
	// ...подпись...
	derEncStep(derOCTEnc(buf, sig->sig, sig->sig_len), buf, count);
	// ...завершить кодирование
	derEncStep(derSEQEncStop(buf, count, Signature), buf, count);
	// возвратить длину DER-кода
	return count;
}